

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O3

void av1_idct8(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  char bit;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int32_t *input_00;
  int iVar5;
  long lVar6;
  undefined7 in_register_00000011;
  long lVar7;
  long lVar8;
  int32_t iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int32_t step [8];
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  long local_40;
  int32_t *local_38;
  
  lVar11 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  *output = *input;
  output[1] = input[4];
  output[2] = input[2];
  output[3] = input[6];
  output[4] = input[1];
  output[5] = input[5];
  output[6] = input[3];
  output[7] = input[7];
  av1_range_check_buf(1,input,output,8,stage_range[1]);
  local_68 = *(undefined8 *)output;
  uStack_60 = *(undefined8 *)(output + 2);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x240);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x180);
  lVar12 = 1L << (cos_bit - 1U & 0x3f);
  local_58 = (int)(output[4] * iVar5 + lVar12 + (long)-(iVar1 * output[7]) >> (cos_bit & 0x3fU));
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1c0);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x200);
  local_54 = (int)(output[5] * iVar2 + lVar12 + (long)-(iVar3 * output[6]) >> (cos_bit & 0x3fU));
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1a0);
  local_50 = (int)(iVar3 * output[5] + lVar12 + (long)(output[6] * iVar2) >> (cos_bit & 0x3fU));
  local_4c = (int)(iVar1 * output[4] + lVar12 + (long)(output[7] * iVar5) >> (cos_bit & 0x3fU));
  local_38 = input;
  av1_range_check_buf(2,input,(int32_t *)&local_68,8,stage_range[2]);
  input_00 = local_38;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1e0);
  local_40 = (long)iVar1;
  lVar6 = (int)local_68 * local_40 + lVar12;
  *output = (int32_t)(local_68._4_4_ * iVar1 + lVar6 >> (cos_bit & 0x3fU));
  output[1] = (int32_t)(local_68._4_4_ * -iVar1 + lVar6 >> (cos_bit & 0x3fU));
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x220);
  output[2] = (int32_t)((int)uStack_60 * iVar5 + lVar12 + (long)-(iVar4 * uStack_60._4_4_) >>
                       (cos_bit & 0x3fU));
  output[3] = (int32_t)(iVar4 * (int)uStack_60 + lVar12 + (long)(uStack_60._4_4_ * iVar5) >>
                       (cos_bit & 0x3fU));
  iVar5 = local_54 + local_58;
  if ('\0' < stage_range[3]) {
    lVar7 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar11 = (long)iVar5;
    lVar6 = lVar7 + -1;
    if (lVar11 < lVar7 + -1) {
      lVar6 = lVar11;
    }
    lVar8 = -lVar7;
    if (SBORROW8(lVar11,-lVar7) == lVar11 + lVar7 < 0) {
      lVar8 = lVar6;
    }
    iVar5 = (int)lVar8;
  }
  output[4] = iVar5;
  iVar5 = local_58 - local_54;
  if ('\0' < stage_range[3]) {
    lVar11 = (long)iVar5;
    lVar7 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar6 = lVar7 + -1;
    if (lVar11 < lVar7 + -1) {
      lVar6 = lVar11;
    }
    lVar8 = -lVar7;
    if (SBORROW8(lVar11,-lVar7) == lVar11 + lVar7 < 0) {
      lVar8 = lVar6;
    }
    iVar5 = (int)lVar8;
  }
  output[5] = iVar5;
  iVar5 = local_4c - local_50;
  if ('\0' < stage_range[3]) {
    lVar11 = (long)iVar5;
    lVar7 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar6 = lVar7 + -1;
    if (lVar11 < lVar7 + -1) {
      lVar6 = lVar11;
    }
    lVar8 = -lVar7;
    if (SBORROW8(lVar11,-lVar7) == lVar11 + lVar7 < 0) {
      lVar8 = lVar6;
    }
    iVar5 = (int)lVar8;
  }
  output[6] = iVar5;
  iVar5 = local_4c + local_50;
  if ('\0' < stage_range[3]) {
    lVar11 = (long)iVar5;
    lVar7 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar6 = lVar7 + -1;
    if (lVar11 < lVar7 + -1) {
      lVar6 = lVar11;
    }
    lVar8 = -lVar7;
    if (SBORROW8(lVar11,-lVar7) == lVar11 + lVar7 < 0) {
      lVar8 = lVar6;
    }
    iVar5 = (int)lVar8;
  }
  output[7] = iVar5;
  av1_range_check_buf(3,local_38,output,8,stage_range[3]);
  uStack_60._4_4_ = *output;
  iVar5 = output[3];
  local_68._0_4_ = iVar5 + uStack_60._4_4_;
  bit = stage_range[4];
  if (bit < '\x01') {
    local_68._4_4_ = output[2] + output[1];
    uStack_60._0_4_ = output[1] - output[2];
    uStack_60._4_4_ = uStack_60._4_4_ - iVar5;
  }
  else {
    lVar7 = 1L << (bit - 1U & 0x3f);
    lVar6 = lVar7 + -1;
    lVar8 = -lVar7;
    lVar10 = (long)(int)local_68;
    lVar11 = lVar6;
    if (lVar10 < lVar6) {
      lVar11 = lVar10;
    }
    if (SBORROW8(lVar10,lVar8) != lVar10 + lVar7 < 0) {
      lVar11 = lVar8;
    }
    local_68._0_4_ = (int)lVar11;
    lVar10 = (long)(output[2] + output[1]);
    lVar11 = lVar6;
    if (lVar10 < lVar6) {
      lVar11 = lVar10;
    }
    if (SBORROW8(lVar10,lVar8) != lVar10 + lVar7 < 0) {
      lVar11 = lVar8;
    }
    local_68._4_4_ = (int)lVar11;
    lVar10 = (long)(output[1] - output[2]);
    lVar11 = lVar6;
    if (lVar10 < lVar6) {
      lVar11 = lVar10;
    }
    if (SBORROW8(lVar10,lVar8) != lVar10 + lVar7 < 0) {
      lVar11 = lVar8;
    }
    uStack_60._0_4_ = (int)lVar11;
    lVar11 = (long)(uStack_60._4_4_ - iVar5);
    if (lVar11 < lVar6) {
      lVar6 = lVar11;
    }
    uStack_60._4_4_ = (int)lVar6;
    if (SBORROW8(lVar11,lVar8) != lVar11 + lVar7 < 0) {
      uStack_60._4_4_ = (int)lVar8;
    }
  }
  local_58 = output[4];
  lVar12 = lVar12 + output[6] * local_40;
  local_54 = (int)(-iVar1 * output[5] + lVar12 >> (cos_bit & 0x3fU));
  local_50 = (int)((int)local_40 * output[5] + lVar12 >> (cos_bit & 0x3fU));
  local_4c = output[7];
  av1_range_check_buf(4,input_00,(int32_t *)&local_68,8,bit);
  iVar5 = local_4c + (int)local_68;
  if ('\0' < stage_range[5]) {
    lVar12 = (long)iVar5;
    lVar11 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar6 = lVar11 + -1;
    if (lVar12 < lVar11 + -1) {
      lVar6 = lVar12;
    }
    lVar7 = -lVar11;
    if (SBORROW8(lVar12,-lVar11) == lVar12 + lVar11 < 0) {
      lVar7 = lVar6;
    }
    iVar5 = (int)lVar7;
  }
  *output = iVar5;
  iVar5 = local_50 + local_68._4_4_;
  if ('\0' < stage_range[5]) {
    lVar12 = (long)iVar5;
    lVar11 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar6 = lVar11 + -1;
    if (lVar12 < lVar11 + -1) {
      lVar6 = lVar12;
    }
    lVar7 = -lVar11;
    if (SBORROW8(lVar12,-lVar11) == lVar12 + lVar11 < 0) {
      lVar7 = lVar6;
    }
    iVar5 = (int)lVar7;
  }
  output[1] = iVar5;
  iVar5 = local_54 + (int)uStack_60;
  if ('\0' < stage_range[5]) {
    lVar12 = (long)iVar5;
    lVar11 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar6 = lVar11 + -1;
    if (lVar12 < lVar11 + -1) {
      lVar6 = lVar12;
    }
    lVar7 = -lVar11;
    if (SBORROW8(lVar12,-lVar11) == lVar12 + lVar11 < 0) {
      lVar7 = lVar6;
    }
    iVar5 = (int)lVar7;
  }
  output[2] = iVar5;
  iVar5 = local_58 + uStack_60._4_4_;
  if ('\0' < stage_range[5]) {
    lVar12 = (long)iVar5;
    lVar11 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar6 = lVar11 + -1;
    if (lVar12 < lVar11 + -1) {
      lVar6 = lVar12;
    }
    lVar7 = -lVar11;
    if (SBORROW8(lVar12,-lVar11) == lVar12 + lVar11 < 0) {
      lVar7 = lVar6;
    }
    iVar5 = (int)lVar7;
  }
  output[3] = iVar5;
  local_58 = uStack_60._4_4_ - local_58;
  if ('\0' < stage_range[5]) {
    lVar12 = (long)local_58;
    lVar11 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar6 = lVar11 + -1;
    if (lVar12 < lVar11 + -1) {
      lVar6 = lVar12;
    }
    lVar7 = -lVar11;
    if (SBORROW8(lVar12,-lVar11) == lVar12 + lVar11 < 0) {
      lVar7 = lVar6;
    }
    local_58 = (int)lVar7;
  }
  output[4] = local_58;
  iVar9 = (int)uStack_60 - local_54;
  if ('\0' < stage_range[5]) {
    lVar12 = (long)iVar9;
    lVar11 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar6 = lVar11 + -1;
    if (lVar12 < lVar11 + -1) {
      lVar6 = lVar12;
    }
    lVar7 = -lVar11;
    if (SBORROW8(lVar12,-lVar11) == lVar12 + lVar11 < 0) {
      lVar7 = lVar6;
    }
    iVar9 = (int32_t)lVar7;
  }
  output[5] = iVar9;
  local_68._4_4_ = local_68._4_4_ - local_50;
  if ('\0' < stage_range[5]) {
    lVar12 = (long)local_68._4_4_;
    lVar11 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar6 = lVar11 + -1;
    if (lVar12 < lVar11 + -1) {
      lVar6 = lVar12;
    }
    lVar7 = -lVar11;
    if (SBORROW8(lVar12,-lVar11) == lVar12 + lVar11 < 0) {
      lVar7 = lVar6;
    }
    local_68._4_4_ = (int)lVar7;
  }
  output[6] = local_68._4_4_;
  local_68._0_4_ = (int)local_68 - local_4c;
  if ('\0' < stage_range[5]) {
    lVar12 = (long)(int)local_68;
    lVar11 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar6 = lVar11 + -1;
    if (lVar12 < lVar11 + -1) {
      lVar6 = lVar12;
    }
    lVar7 = -lVar11;
    if (SBORROW8(lVar12,-lVar11) == lVar12 + lVar11 < 0) {
      lVar7 = lVar6;
    }
    local_68._0_4_ = (int)lVar7;
  }
  output[7] = (int)local_68;
  return;
}

Assistant:

void av1_idct8(const int32_t *input, int32_t *output, int8_t cos_bit,
               const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 8;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[8];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = input[4];
  bf1[2] = input[2];
  bf1[3] = input[6];
  bf1[4] = input[1];
  bf1[5] = input[5];
  bf1[6] = input[3];
  bf1[7] = input[7];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[56], bf0[4], -cospi[8], bf0[7], cos_bit);
  bf1[5] = half_btf(cospi[24], bf0[5], -cospi[40], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[40], bf0[5], cospi[24], bf0[6], cos_bit);
  bf1[7] = half_btf(cospi[8], bf0[4], cospi[56], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[32], bf0[0], -cospi[32], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], -cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[16], bf0[2], cospi[48], bf0[3], cos_bit);
  bf1[4] = clamp_value(bf0[4] + bf0[5], stage_range[stage]);
  bf1[5] = clamp_value(bf0[4] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(-bf0[6] + bf0[7], stage_range[stage]);
  bf1[7] = clamp_value(bf0[6] + bf0[7], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = clamp_value(bf0[0] + bf0[3], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[2], stage_range[stage]);
  bf1[2] = clamp_value(bf0[1] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[0] - bf0[3], stage_range[stage]);
  bf1[4] = bf0[4];
  bf1[5] = half_btf(-cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[7] = bf0[7];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[7], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[6], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[5], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[4], stage_range[stage]);
  bf1[4] = clamp_value(bf0[3] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[2] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[1] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[0] - bf0[7], stage_range[stage]);
}